

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall slang::driver::Driver::addStandardArgs(Driver *this)

{
  string_view valueName;
  string_view desc;
  string_view desc_00;
  string_view desc_01;
  string_view desc_02;
  string_view desc_03;
  string_view desc_04;
  string_view desc_05;
  string_view desc_06;
  string_view desc_07;
  string_view desc_08;
  string_view desc_09;
  string_view desc_10;
  string_view desc_11;
  string_view desc_12;
  string_view desc_13;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view desc_14;
  string_view desc_15;
  string_view desc_16;
  string_view desc_17;
  string_view desc_18;
  string_view desc_19;
  string_view desc_20;
  string_view desc_21;
  string_view desc_22;
  string_view desc_23;
  string_view desc_24;
  string_view desc_25;
  string_view desc_26;
  string_view desc_27;
  string_view desc_28;
  string_view desc_29;
  string_view desc_30;
  string_view desc_31;
  string_view desc_32;
  string_view name_14;
  string_view name_15;
  string_view desc_33;
  string_view desc_34;
  string_view desc_35;
  string_view desc_36;
  string_view desc_37;
  string_view desc_38;
  string_view desc_39;
  string_view desc_40;
  string_view desc_41;
  string_view desc_42;
  string_view desc_43;
  string_view desc_44;
  string_view desc_45;
  string_view desc_46;
  string_view desc_47;
  string_view desc_48;
  string_view desc_49;
  string_view desc_50;
  string_view desc_51;
  string_view desc_52;
  string_view desc_53;
  string_view desc_54;
  string_view desc_55;
  string_view name_16;
  string_view name_17;
  string_view name_18;
  string_view name_19;
  string_view name_20;
  string_view name_21;
  string_view name_22;
  string_view name_23;
  string_view desc_56;
  string_view desc_57;
  string_view desc_58;
  string_view desc_59;
  string_view desc_60;
  string_view name_24;
  string_view desc_61;
  string_view desc_62;
  string_view desc_63;
  string_view desc_64;
  string_view desc_65;
  string_view desc_66;
  string_view desc_67;
  string_view name_25;
  string_view name_26;
  string_view desc_68;
  string_view name_27;
  string_view name_28;
  string_view name_29;
  string_view name_30;
  string_view name_31;
  string_view name_32;
  string_view name_33;
  string_view name_34;
  string_view name_35;
  string_view name_36;
  string_view name_37;
  string_view name_38;
  string_view name_39;
  string_view name_40;
  string_view name_41;
  string_view name_42;
  string_view name_43;
  string_view name_44;
  string_view name_45;
  string_view name_46;
  string_view name_47;
  string_view name_48;
  string_view name_49;
  string_view name_50;
  string_view name_51;
  string_view name_52;
  string_view name_53;
  string_view name_54;
  string_view name_55;
  string_view name_56;
  string_view name_57;
  string_view name_58;
  string_view name_59;
  string_view name_60;
  string_view name_61;
  string_view name_62;
  string_view name_63;
  string_view name_64;
  string_view name_65;
  string_view name_66;
  string_view name_67;
  string_view name_68;
  string_view valueName_00;
  string_view valueName_01;
  string_view valueName_02;
  string_view valueName_03;
  string_view valueName_04;
  string_view valueName_05;
  string_view valueName_06;
  string_view valueName_07;
  string_view valueName_08;
  string_view valueName_09;
  string_view valueName_10;
  string_view valueName_11;
  string_view valueName_12;
  string_view valueName_13;
  string_view valueName_14;
  string_view valueName_15;
  string_view valueName_16;
  string_view valueName_17;
  string_view valueName_18;
  string_view valueName_19;
  string_view valueName_20;
  string_view valueName_21;
  string_view valueName_22;
  string_view valueName_23;
  string_view valueName_24;
  string_view valueName_25;
  string_view valueName_26;
  string_view valueName_27;
  string_view valueName_28;
  string_view valueName_29;
  string_view valueName_30;
  string_view valueName_31;
  string_view valueName_32;
  string_view valueName_33;
  string_view valueName_34;
  string_view valueName_35;
  string_view valueName_36;
  string_view valueName_37;
  string_view valueName_38;
  string_view valueName_39;
  string_view valueName_40;
  string_view valueName_41;
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  CommandLine *this_00;
  CommandLine *this_01;
  long in_RDI;
  anon_class_8_1_8991fb9c addCompFlag;
  undefined4 in_stack_ffffffffffffeda8;
  bitmask<slang::CommandLineFlags> bVar6;
  undefined4 in_stack_ffffffffffffedac;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_ffffffffffffedb0;
  OptionCallback *in_stack_ffffffffffffedd0;
  CommandLine *in_stack_ffffffffffffedd8;
  undefined8 in_stack_ffffffffffffede0;
  bitmask<slang::CommandLineFlags> flags;
  size_t in_stack_ffffffffffffede8;
  char *in_stack_ffffffffffffedf0;
  undefined8 in_stack_ffffffffffffee08;
  CompilationFlags flag;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffee10;
  size_t in_stack_ffffffffffffee18;
  char *in_stack_ffffffffffffee20;
  size_t in_stack_ffffffffffffee28;
  optional<bool> *in_stack_ffffffffffffee30;
  optional<bool> *value;
  CommandLine *in_stack_ffffffffffffee38;
  OptionCallback *in_stack_ffffffffffffee40;
  OptionCallback *cb;
  CommandLine *in_stack_ffffffffffffee48;
  undefined4 in_stack_ffffffffffffee50;
  bitmask<slang::CommandLineFlags> in_stack_ffffffffffffee54;
  undefined1 *puVar7;
  size_t in_stack_ffffffffffffee58;
  char *in_stack_ffffffffffffee60;
  size_t in_stack_ffffffffffffee68;
  undefined1 *puVar8;
  char *in_stack_ffffffffffffee70;
  size_t in_stack_ffffffffffffee80;
  char *in_stack_ffffffffffffee88;
  bitmask<slang::CommandLineFlags> local_fa4 [14];
  bitmask<slang::CommandLineFlags> local_f6c [10];
  bitmask<slang::CommandLineFlags> local_f44 [10];
  bitmask<slang::CommandLineFlags> local_f1c [24];
  bitmask<slang::CommandLineFlags> local_ebc [24];
  bitmask<slang::CommandLineFlags> local_e5c [16];
  bitmask<slang::CommandLineFlags> local_e1c [24];
  bitmask<slang::CommandLineFlags> local_dbc [11];
  optional<bool> local_d90 [26];
  bitmask<slang::CommandLineFlags> local_d5c [11];
  OptionCallback local_d30;
  bitmask<slang::CommandLineFlags> local_cfc [11];
  undefined1 local_cd0 [52];
  bitmask<slang::CommandLineFlags> local_c9c [11];
  undefined1 local_c70 [52];
  bitmask<slang::CommandLineFlags> local_c3c [10];
  bitmask<slang::CommandLineFlags> local_c14 [24];
  bitmask<slang::CommandLineFlags> local_bb4 [24];
  bitmask<slang::CommandLineFlags> local_b54 [14];
  bitmask<slang::CommandLineFlags> local_b1c [14];
  bitmask<slang::CommandLineFlags> local_ae4 [14];
  bitmask<slang::CommandLineFlags> local_aac [10];
  bitmask<slang::CommandLineFlags> local_a84 [10];
  bitmask<slang::CommandLineFlags> local_a5c [10];
  bitmask<slang::CommandLineFlags> local_a34 [10];
  bitmask<slang::CommandLineFlags> local_a0c [10];
  bitmask<slang::CommandLineFlags> local_9e4 [10];
  bitmask<slang::CommandLineFlags> local_9bc [10];
  bitmask<slang::CommandLineFlags> local_994 [10];
  bitmask<slang::CommandLineFlags> local_96c [14];
  bitmask<slang::CommandLineFlags> local_934 [14];
  bitmask<slang::CommandLineFlags> local_8fc [14];
  bitmask<slang::CommandLineFlags> local_8c4 [14];
  bitmask<slang::CommandLineFlags> local_88c [136];
  bitmask<slang::CommandLineFlags> local_66c [14];
  bitmask<slang::CommandLineFlags> local_634 [14];
  bitmask<slang::CommandLineFlags> local_5fc [14];
  bitmask<slang::CommandLineFlags> local_5c4 [14];
  bitmask<slang::CommandLineFlags> local_58c [14];
  bitmask<slang::CommandLineFlags> local_554 [14];
  bitmask<slang::CommandLineFlags> local_51c [14];
  bitmask<slang::CommandLineFlags> local_4e4 [14];
  bitmask<slang::CommandLineFlags> local_4ac [14];
  bitmask<slang::CommandLineFlags> local_474 [14];
  bitmask<slang::CommandLineFlags> local_43c [24];
  bitmask<slang::CommandLineFlags> local_3dc [14];
  bitmask<slang::CommandLineFlags> local_3a4 [14];
  bitmask<slang::CommandLineFlags> local_36c [14];
  bitmask<slang::CommandLineFlags> local_334 [14];
  bitmask<slang::CommandLineFlags> local_2fc [24];
  bitmask<slang::CommandLineFlags> local_29c [24];
  bitmask<slang::CommandLineFlags> local_23c [14];
  bitmask<slang::CommandLineFlags> local_204 [10];
  bitmask<slang::CommandLineFlags> local_1dc [10];
  bitmask<slang::CommandLineFlags> local_1b4 [14];
  bitmask<slang::CommandLineFlags> local_17c [14];
  bitmask<slang::CommandLineFlags> local_144 [14];
  bitmask<slang::CommandLineFlags> local_10c [28];
  bitmask<slang::CommandLineFlags> local_9c [24];
  bitmask<slang::CommandLineFlags> local_3c [15];
  
  flags.m_bits = (underlying_type)((ulong)in_stack_ffffffffffffede0 >> 0x20);
  flag = (CompilationFlags)((ulong)in_stack_ffffffffffffee08 >> 0x20);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8));
  local_3c[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_3c);
  name_27._M_str = in_stack_ffffffffffffee70;
  name_27._M_len = in_stack_ffffffffffffee68;
  desc_27._M_str = in_stack_ffffffffffffee60;
  desc_27._M_len = in_stack_ffffffffffffee58;
  valueName_00._M_str = in_stack_ffffffffffffee88;
  valueName_00._M_len = in_stack_ffffffffffffee80;
  bVar6.m_bits = local_3c[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_27,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffee40,desc_27,valueName_00,in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>::
  function<slang::driver::Driver::addStandardArgs()::__0,void>
            (in_stack_ffffffffffffedb0,
             (anon_class_8_1_8991fb9c *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  bitmask<slang::CommandLineFlags>::bitmask(local_9c,CommaList);
  name_28._M_str = in_stack_ffffffffffffee70;
  name_28._M_len = in_stack_ffffffffffffee68;
  desc_28._M_str = in_stack_ffffffffffffee60;
  desc_28._M_len = in_stack_ffffffffffffee58;
  valueName_01._M_str = in_stack_ffffffffffffee88;
  valueName_01._M_len = in_stack_ffffffffffffee80;
  CommandLine::add(in_stack_ffffffffffffee48,name_28,in_stack_ffffffffffffee40,desc_28,valueName_01,
                   in_stack_ffffffffffffee54);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x1c3b6f);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_9c[0].m_bits));
  std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>::
  function<slang::driver::Driver::addStandardArgs()::__1,void>
            (in_stack_ffffffffffffedb0,
             (anon_class_8_1_8991fb9c *)CONCAT44(in_stack_ffffffffffffedac,local_9c[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_9c[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_9c[0].m_bits));
  bitmask<slang::CommandLineFlags>::bitmask(local_10c,CommaList);
  name_29._M_str = in_stack_ffffffffffffee70;
  name_29._M_len = in_stack_ffffffffffffee68;
  desc_29._M_str = in_stack_ffffffffffffee60;
  desc_29._M_len = in_stack_ffffffffffffee58;
  valueName_02._M_str = in_stack_ffffffffffffee88;
  valueName_02._M_len = in_stack_ffffffffffffee80;
  CommandLine::add(in_stack_ffffffffffffee48,name_29,in_stack_ffffffffffffee40,desc_29,valueName_02,
                   in_stack_ffffffffffffee54);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x1c3c5e);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_10c[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_10c[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_10c[0].m_bits));
  local_144[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_144);
  name_30._M_str = in_stack_ffffffffffffee70;
  name_30._M_len = in_stack_ffffffffffffee68;
  desc_30._M_str = in_stack_ffffffffffffee60;
  desc_30._M_len = in_stack_ffffffffffffee58;
  valueName_03._M_str = in_stack_ffffffffffffee88;
  valueName_03._M_len = in_stack_ffffffffffffee80;
  bVar6.m_bits = local_144[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_30,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffee40,desc_30,valueName_03,in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  bitmask<slang::CommandLineFlags>::bitmask(local_17c,CommaList);
  name_31._M_str = in_stack_ffffffffffffee70;
  name_31._M_len = in_stack_ffffffffffffee68;
  desc_31._M_str = in_stack_ffffffffffffee60;
  desc_31._M_len = in_stack_ffffffffffffee58;
  valueName_04._M_str = in_stack_ffffffffffffee88;
  valueName_04._M_len = in_stack_ffffffffffffee80;
  CommandLine::add(in_stack_ffffffffffffee48,name_31,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffee40,desc_31,valueName_04,in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_17c[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_17c[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_17c[0].m_bits));
  local_1b4[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_1b4);
  name_32._M_str = in_stack_ffffffffffffee70;
  name_32._M_len = in_stack_ffffffffffffee68;
  desc_32._M_str = in_stack_ffffffffffffee60;
  desc_32._M_len = in_stack_ffffffffffffee58;
  valueName_05._M_str = in_stack_ffffffffffffee88;
  valueName_05._M_len = in_stack_ffffffffffffee80;
  bVar6.m_bits = local_1b4[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_32,
                   (optional<unsigned_int> *)in_stack_ffffffffffffee40,desc_32,valueName_05,
                   in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_1dc[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_1dc);
  name_14._M_str = in_stack_ffffffffffffee60;
  name_14._M_len = in_stack_ffffffffffffee58;
  desc_14._M_str._0_4_ = in_stack_ffffffffffffee50;
  desc_14._M_len = (size_t)in_stack_ffffffffffffee48;
  desc_14._M_str._4_4_ = in_stack_ffffffffffffee54.m_bits;
  CommandLine::add(in_stack_ffffffffffffee38,name_14,in_stack_ffffffffffffee30,desc_14,
                   (bitmask<slang::CommandLineFlags>)
                   (underlying_type)((ulong)in_stack_ffffffffffffee40 >> 0x20));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_204[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_204);
  name_15._M_str = in_stack_ffffffffffffee60;
  name_15._M_len = in_stack_ffffffffffffee58;
  desc_15._M_str._0_4_ = in_stack_ffffffffffffee50;
  desc_15._M_len = (size_t)in_stack_ffffffffffffee48;
  desc_15._M_str._4_4_ = in_stack_ffffffffffffee54.m_bits;
  CommandLine::add(in_stack_ffffffffffffee38,name_15,in_stack_ffffffffffffee30,desc_15,
                   (bitmask<slang::CommandLineFlags>)
                   (underlying_type)((ulong)in_stack_ffffffffffffee40 >> 0x20));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_23c[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_23c);
  name_33._M_str = in_stack_ffffffffffffee70;
  name_33._M_len = in_stack_ffffffffffffee68;
  desc_33._M_str = in_stack_ffffffffffffee60;
  desc_33._M_len = in_stack_ffffffffffffee58;
  valueName_06._M_str = in_stack_ffffffffffffee88;
  valueName_06._M_len = in_stack_ffffffffffffee80;
  bVar6.m_bits = local_23c[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_33,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffee40,desc_33,valueName_06,in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>::
  function<slang::driver::Driver::addStandardArgs()::__2,void>
            (in_stack_ffffffffffffedb0,
             (anon_class_8_1_8991fb9c *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_29c[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_29c);
  name_34._M_str = in_stack_ffffffffffffee70;
  name_34._M_len = in_stack_ffffffffffffee68;
  desc_34._M_str = in_stack_ffffffffffffee60;
  desc_34._M_len = in_stack_ffffffffffffee58;
  valueName_07._M_str = in_stack_ffffffffffffee88;
  valueName_07._M_len = in_stack_ffffffffffffee80;
  bVar6.m_bits = local_29c[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_34,in_stack_ffffffffffffee40,desc_34,valueName_07,
                   in_stack_ffffffffffffee54);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x1c4163);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>::
  function<slang::driver::Driver::addStandardArgs()::__3,void>
            (in_stack_ffffffffffffedb0,
             (anon_class_8_1_8991fb9c *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_2fc[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_2fc);
  name_35._M_str = in_stack_ffffffffffffee70;
  name_35._M_len = in_stack_ffffffffffffee68;
  desc_35._M_str = in_stack_ffffffffffffee60;
  desc_35._M_len = in_stack_ffffffffffffee58;
  valueName_08._M_str = in_stack_ffffffffffffee88;
  valueName_08._M_len = in_stack_ffffffffffffee80;
  bVar6.m_bits = local_2fc[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_35,in_stack_ffffffffffffee40,desc_35,valueName_08,
                   in_stack_ffffffffffffee54);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x1c4258);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  bitmask<slang::CommandLineFlags>::bitmask(local_334,CommaList);
  name_36._M_str = in_stack_ffffffffffffee70;
  name_36._M_len = in_stack_ffffffffffffee68;
  desc_36._M_str = in_stack_ffffffffffffee60;
  desc_36._M_len = in_stack_ffffffffffffee58;
  valueName_09._M_str = in_stack_ffffffffffffee88;
  valueName_09._M_len = in_stack_ffffffffffffee80;
  CommandLine::add(in_stack_ffffffffffffee48,name_36,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffee40,desc_36,valueName_09,in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_334[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_334[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_334[0].m_bits));
  local_36c[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_36c);
  name_37._M_str = in_stack_ffffffffffffee70;
  name_37._M_len = in_stack_ffffffffffffee68;
  desc_37._M_str = in_stack_ffffffffffffee60;
  desc_37._M_len = in_stack_ffffffffffffee58;
  valueName_10._M_str = in_stack_ffffffffffffee88;
  valueName_10._M_len = in_stack_ffffffffffffee80;
  bVar6.m_bits = local_36c[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_37,
                   (optional<unsigned_int> *)in_stack_ffffffffffffee40,desc_37,valueName_10,
                   in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_3a4[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_3a4);
  name_38._M_str = in_stack_ffffffffffffee70;
  name_38._M_len = in_stack_ffffffffffffee68;
  desc_38._M_str = in_stack_ffffffffffffee60;
  desc_38._M_len = in_stack_ffffffffffffee58;
  valueName_11._M_str = in_stack_ffffffffffffee88;
  valueName_11._M_len = in_stack_ffffffffffffee80;
  bVar6.m_bits = local_3a4[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_38,
                   (optional<unsigned_int> *)in_stack_ffffffffffffee40,desc_38,valueName_11,
                   in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_3dc[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_3dc);
  name_39._M_str = in_stack_ffffffffffffee70;
  name_39._M_len = in_stack_ffffffffffffee68;
  desc_39._M_str = in_stack_ffffffffffffee60;
  desc_39._M_len = in_stack_ffffffffffffee58;
  valueName_12._M_str = in_stack_ffffffffffffee88;
  valueName_12._M_len = in_stack_ffffffffffffee80;
  bVar6.m_bits = local_3dc[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_39,
                   (optional<unsigned_int> *)in_stack_ffffffffffffee40,desc_39,valueName_12,
                   in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>::
  function<slang::driver::Driver::addStandardArgs()::__4,void>
            (in_stack_ffffffffffffedb0,
             (anon_class_8_1_8991fb9c *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  bitmask<slang::CommandLineFlags>::bitmask(local_43c,CommaList);
  name_40._M_str = in_stack_ffffffffffffee70;
  name_40._M_len = in_stack_ffffffffffffee68;
  desc_40._M_str = in_stack_ffffffffffffee60;
  desc_40._M_len = in_stack_ffffffffffffee58;
  valueName_13._M_str = in_stack_ffffffffffffee88;
  valueName_13._M_len = in_stack_ffffffffffffee80;
  CommandLine::add(in_stack_ffffffffffffee48,name_40,in_stack_ffffffffffffee40,desc_40,valueName_13,
                   in_stack_ffffffffffffee54);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x1c4637);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_43c[0].m_bits));
  sVar1 = in_RDI + 0x1260;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_43c[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_43c[0].m_bits));
  local_474[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_474);
  name_41._M_str = in_stack_ffffffffffffee70;
  name_41._M_len = in_stack_ffffffffffffee68;
  desc_41._M_str = in_stack_ffffffffffffee60;
  desc_41._M_len = in_stack_ffffffffffffee58;
  valueName_14._M_str = in_stack_ffffffffffffee88;
  valueName_14._M_len = sVar1;
  bVar6.m_bits = local_474[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_41,
                   (optional<unsigned_int> *)in_stack_ffffffffffffee40,desc_41,valueName_14,
                   in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  pcVar2 = (char *)(in_RDI + 0x1268);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_4ac[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_4ac);
  name_42._M_str = in_stack_ffffffffffffee70;
  name_42._M_len = in_stack_ffffffffffffee68;
  desc_42._M_str = in_stack_ffffffffffffee60;
  desc_42._M_len = in_stack_ffffffffffffee58;
  valueName_15._M_str = pcVar2;
  valueName_15._M_len = sVar1;
  bVar6.m_bits = local_4ac[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_42,
                   (optional<unsigned_int> *)in_stack_ffffffffffffee40,desc_42,valueName_15,
                   in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_4e4[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_4e4);
  name_43._M_str = in_stack_ffffffffffffee70;
  name_43._M_len = in_stack_ffffffffffffee68;
  desc_43._M_str = in_stack_ffffffffffffee60;
  desc_43._M_len = in_stack_ffffffffffffee58;
  valueName_16._M_str = pcVar2;
  valueName_16._M_len = sVar1;
  bVar6.m_bits = local_4e4[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_43,
                   (optional<unsigned_int> *)in_stack_ffffffffffffee40,desc_43,valueName_16,
                   in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_51c[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_51c);
  name_44._M_str = in_stack_ffffffffffffee70;
  name_44._M_len = in_stack_ffffffffffffee68;
  desc_44._M_str = in_stack_ffffffffffffee60;
  desc_44._M_len = in_stack_ffffffffffffee58;
  valueName_17._M_str = pcVar2;
  valueName_17._M_len = sVar1;
  bVar6.m_bits = local_51c[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_44,
                   (optional<unsigned_int> *)in_stack_ffffffffffffee40,desc_44,valueName_17,
                   in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_554[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_554);
  name_45._M_str = in_stack_ffffffffffffee70;
  name_45._M_len = in_stack_ffffffffffffee68;
  desc_45._M_str = in_stack_ffffffffffffee60;
  desc_45._M_len = in_stack_ffffffffffffee58;
  valueName_18._M_str = pcVar2;
  valueName_18._M_len = sVar1;
  bVar6.m_bits = local_554[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_45,
                   (optional<unsigned_int> *)in_stack_ffffffffffffee40,desc_45,valueName_18,
                   in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_58c[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_58c);
  name_46._M_str = in_stack_ffffffffffffee70;
  name_46._M_len = in_stack_ffffffffffffee68;
  desc_46._M_str = in_stack_ffffffffffffee60;
  desc_46._M_len = in_stack_ffffffffffffee58;
  valueName_19._M_str = pcVar2;
  valueName_19._M_len = sVar1;
  bVar6.m_bits = local_58c[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_46,
                   (optional<unsigned_int> *)in_stack_ffffffffffffee40,desc_46,valueName_19,
                   in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_5c4[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_5c4);
  name_47._M_str = in_stack_ffffffffffffee70;
  name_47._M_len = in_stack_ffffffffffffee68;
  desc_47._M_str = in_stack_ffffffffffffee60;
  desc_47._M_len = in_stack_ffffffffffffee58;
  valueName_20._M_str = pcVar2;
  valueName_20._M_len = sVar1;
  bVar6.m_bits = local_5c4[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_47,
                   (optional<unsigned_int> *)in_stack_ffffffffffffee40,desc_47,valueName_20,
                   in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_5fc[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_5fc);
  name_48._M_str = in_stack_ffffffffffffee70;
  name_48._M_len = in_stack_ffffffffffffee68;
  desc_48._M_str = in_stack_ffffffffffffee60;
  desc_48._M_len = in_stack_ffffffffffffee58;
  valueName_21._M_str = pcVar2;
  valueName_21._M_len = sVar1;
  bVar6.m_bits = local_5fc[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_48,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffee40,desc_48,valueName_21,in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_634[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_634);
  name_49._M_str = in_stack_ffffffffffffee70;
  name_49._M_len = in_stack_ffffffffffffee68;
  desc_49._M_str = in_stack_ffffffffffffee60;
  desc_49._M_len = in_stack_ffffffffffffee58;
  valueName_22._M_str = pcVar2;
  valueName_22._M_len = sVar1;
  bVar6.m_bits = local_634[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_49,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffee40,desc_49,valueName_22,in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_66c[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_66c);
  name_50._M_str = in_stack_ffffffffffffee70;
  name_50._M_len = in_stack_ffffffffffffee68;
  desc_50._M_str = in_stack_ffffffffffffee60;
  desc_50._M_len = in_stack_ffffffffffffee58;
  valueName_23._M_str = pcVar2;
  valueName_23._M_len = sVar1;
  bVar6.m_bits = local_66c[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_50,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffee40,desc_50,valueName_23,in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  name._M_str = (char *)in_stack_ffffffffffffee30;
  name._M_len = in_stack_ffffffffffffee28;
  desc._M_str = in_stack_ffffffffffffee20;
  desc._M_len = in_stack_ffffffffffffee18;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()(in_stack_ffffffffffffee10,flag,name,desc);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  name_00._M_str = (char *)in_stack_ffffffffffffee30;
  name_00._M_len = in_stack_ffffffffffffee28;
  desc_00._M_str = in_stack_ffffffffffffee20;
  desc_00._M_len = in_stack_ffffffffffffee18;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (in_stack_ffffffffffffee10,flag,name_00,desc_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  name_01._M_str = (char *)in_stack_ffffffffffffee30;
  name_01._M_len = in_stack_ffffffffffffee28;
  desc_01._M_str = in_stack_ffffffffffffee20;
  desc_01._M_len = in_stack_ffffffffffffee18;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (in_stack_ffffffffffffee10,flag,name_01,desc_01);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  name_02._M_str = (char *)in_stack_ffffffffffffee30;
  name_02._M_len = in_stack_ffffffffffffee28;
  desc_02._M_str = in_stack_ffffffffffffee20;
  desc_02._M_len = in_stack_ffffffffffffee18;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (in_stack_ffffffffffffee10,flag,name_02,desc_02);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  name_03._M_str = (char *)in_stack_ffffffffffffee30;
  name_03._M_len = in_stack_ffffffffffffee28;
  desc_03._M_str = in_stack_ffffffffffffee20;
  desc_03._M_len = in_stack_ffffffffffffee18;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (in_stack_ffffffffffffee10,flag,name_03,desc_03);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  name_04._M_str = (char *)in_stack_ffffffffffffee30;
  name_04._M_len = in_stack_ffffffffffffee28;
  desc_04._M_str = in_stack_ffffffffffffee20;
  desc_04._M_len = in_stack_ffffffffffffee18;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (in_stack_ffffffffffffee10,flag,name_04,desc_04);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  name_05._M_str = (char *)in_stack_ffffffffffffee30;
  name_05._M_len = in_stack_ffffffffffffee28;
  desc_05._M_str = in_stack_ffffffffffffee20;
  desc_05._M_len = in_stack_ffffffffffffee18;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (in_stack_ffffffffffffee10,flag,name_05,desc_05);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  name_06._M_str = (char *)in_stack_ffffffffffffee30;
  name_06._M_len = in_stack_ffffffffffffee28;
  desc_06._M_str = in_stack_ffffffffffffee20;
  desc_06._M_len = in_stack_ffffffffffffee18;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (in_stack_ffffffffffffee10,flag,name_06,desc_06);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  name_07._M_str = (char *)in_stack_ffffffffffffee30;
  name_07._M_len = in_stack_ffffffffffffee28;
  desc_07._M_str = in_stack_ffffffffffffee20;
  desc_07._M_len = in_stack_ffffffffffffee18;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (in_stack_ffffffffffffee10,flag,name_07,desc_07);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  name_08._M_str = (char *)in_stack_ffffffffffffee30;
  name_08._M_len = in_stack_ffffffffffffee28;
  desc_08._M_str = in_stack_ffffffffffffee20;
  desc_08._M_len = in_stack_ffffffffffffee18;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (in_stack_ffffffffffffee10,flag,name_08,desc_08);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  name_09._M_str = (char *)in_stack_ffffffffffffee30;
  name_09._M_len = in_stack_ffffffffffffee28;
  desc_09._M_str = in_stack_ffffffffffffee20;
  desc_09._M_len = in_stack_ffffffffffffee18;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (in_stack_ffffffffffffee10,flag,name_09,desc_09);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  name_10._M_str = (char *)in_stack_ffffffffffffee30;
  name_10._M_len = in_stack_ffffffffffffee28;
  desc_10._M_str = in_stack_ffffffffffffee20;
  desc_10._M_len = in_stack_ffffffffffffee18;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (in_stack_ffffffffffffee10,flag,name_10,desc_10);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  name_11._M_str = (char *)in_stack_ffffffffffffee30;
  name_11._M_len = in_stack_ffffffffffffee28;
  desc_11._M_str = in_stack_ffffffffffffee20;
  desc_11._M_len = in_stack_ffffffffffffee18;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (in_stack_ffffffffffffee10,flag,name_11,desc_11);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  name_12._M_str = (char *)in_stack_ffffffffffffee30;
  name_12._M_len = in_stack_ffffffffffffee28;
  desc_12._M_str = in_stack_ffffffffffffee20;
  desc_12._M_len = in_stack_ffffffffffffee18;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (in_stack_ffffffffffffee10,flag,name_12,desc_12);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  name_13._M_str = (char *)in_stack_ffffffffffffee30;
  name_13._M_len = in_stack_ffffffffffffee28;
  desc_13._M_str = in_stack_ffffffffffffee20;
  desc_13._M_len = in_stack_ffffffffffffee18;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (in_stack_ffffffffffffee10,flag,name_13,desc_13);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  bitmask<slang::CommandLineFlags>::bitmask(local_88c,CommaList);
  name_51._M_str = in_stack_ffffffffffffee70;
  name_51._M_len = in_stack_ffffffffffffee68;
  desc_51._M_str = in_stack_ffffffffffffee60;
  desc_51._M_len = in_stack_ffffffffffffee58;
  valueName_24._M_str = pcVar2;
  valueName_24._M_len = sVar1;
  CommandLine::add(in_stack_ffffffffffffee48,name_51,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffee40,desc_51,valueName_24,in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_88c[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_88c[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_88c[0].m_bits));
  local_8c4[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_8c4);
  name_52._M_str = in_stack_ffffffffffffee70;
  name_52._M_len = in_stack_ffffffffffffee68;
  desc_52._M_str = in_stack_ffffffffffffee60;
  desc_52._M_len = in_stack_ffffffffffffee58;
  valueName_25._M_str = pcVar2;
  valueName_25._M_len = sVar1;
  bVar6.m_bits = local_8c4[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_52,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffee40,desc_52,valueName_25,in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  bitmask<slang::CommandLineFlags>::bitmask(local_8fc,CommaList);
  name_53._M_str = in_stack_ffffffffffffee70;
  name_53._M_len = in_stack_ffffffffffffee68;
  desc_53._M_str = in_stack_ffffffffffffee60;
  desc_53._M_len = in_stack_ffffffffffffee58;
  valueName_26._M_str = pcVar2;
  valueName_26._M_len = sVar1;
  CommandLine::add(in_stack_ffffffffffffee48,name_53,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffee40,desc_53,valueName_26,in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_8fc[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_8fc[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_8fc[0].m_bits));
  local_934[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_934);
  name_54._M_str = in_stack_ffffffffffffee70;
  name_54._M_len = in_stack_ffffffffffffee68;
  desc_54._M_str = in_stack_ffffffffffffee60;
  desc_54._M_len = in_stack_ffffffffffffee58;
  valueName_27._M_str = pcVar2;
  valueName_27._M_len = sVar1;
  bVar6.m_bits = local_934[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_54,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffee40,desc_54,valueName_27,in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_96c[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_96c);
  name_55._M_str = in_stack_ffffffffffffee70;
  name_55._M_len = in_stack_ffffffffffffee68;
  desc_55._M_str = in_stack_ffffffffffffee60;
  desc_55._M_len = in_stack_ffffffffffffee58;
  valueName_28._M_str = pcVar2;
  valueName_28._M_len = sVar1;
  bVar6.m_bits = local_96c[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_55,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffee40,desc_55,valueName_28,in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_994[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_994);
  name_16._M_str = in_stack_ffffffffffffee60;
  name_16._M_len = in_stack_ffffffffffffee58;
  desc_16._M_str._0_4_ = in_stack_ffffffffffffee50;
  desc_16._M_len = (size_t)in_stack_ffffffffffffee48;
  desc_16._M_str._4_4_ = in_stack_ffffffffffffee54.m_bits;
  CommandLine::add(in_stack_ffffffffffffee38,name_16,in_stack_ffffffffffffee30,desc_16,
                   (bitmask<slang::CommandLineFlags>)
                   (underlying_type)((ulong)in_stack_ffffffffffffee40 >> 0x20));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_9bc[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_9bc);
  name_17._M_str = in_stack_ffffffffffffee60;
  name_17._M_len = in_stack_ffffffffffffee58;
  desc_17._M_str._0_4_ = in_stack_ffffffffffffee50;
  desc_17._M_len = (size_t)in_stack_ffffffffffffee48;
  desc_17._M_str._4_4_ = in_stack_ffffffffffffee54.m_bits;
  CommandLine::add(in_stack_ffffffffffffee38,name_17,in_stack_ffffffffffffee30,desc_17,
                   (bitmask<slang::CommandLineFlags>)
                   (underlying_type)((ulong)in_stack_ffffffffffffee40 >> 0x20));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_9e4[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_9e4);
  name_18._M_str = in_stack_ffffffffffffee60;
  name_18._M_len = in_stack_ffffffffffffee58;
  desc_18._M_str._0_4_ = in_stack_ffffffffffffee50;
  desc_18._M_len = (size_t)in_stack_ffffffffffffee48;
  desc_18._M_str._4_4_ = in_stack_ffffffffffffee54.m_bits;
  CommandLine::add(in_stack_ffffffffffffee38,name_18,in_stack_ffffffffffffee30,desc_18,
                   (bitmask<slang::CommandLineFlags>)
                   (underlying_type)((ulong)in_stack_ffffffffffffee40 >> 0x20));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_a0c[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_a0c);
  name_19._M_str = in_stack_ffffffffffffee60;
  name_19._M_len = in_stack_ffffffffffffee58;
  desc_19._M_str._0_4_ = in_stack_ffffffffffffee50;
  desc_19._M_len = (size_t)in_stack_ffffffffffffee48;
  desc_19._M_str._4_4_ = in_stack_ffffffffffffee54.m_bits;
  CommandLine::add(in_stack_ffffffffffffee38,name_19,in_stack_ffffffffffffee30,desc_19,
                   (bitmask<slang::CommandLineFlags>)
                   (underlying_type)((ulong)in_stack_ffffffffffffee40 >> 0x20));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_a34[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_a34);
  name_20._M_str = in_stack_ffffffffffffee60;
  name_20._M_len = in_stack_ffffffffffffee58;
  desc_20._M_str._0_4_ = in_stack_ffffffffffffee50;
  desc_20._M_len = (size_t)in_stack_ffffffffffffee48;
  desc_20._M_str._4_4_ = in_stack_ffffffffffffee54.m_bits;
  CommandLine::add(in_stack_ffffffffffffee38,name_20,in_stack_ffffffffffffee30,desc_20,
                   (bitmask<slang::CommandLineFlags>)
                   (underlying_type)((ulong)in_stack_ffffffffffffee40 >> 0x20));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_a5c[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_a5c);
  name_21._M_str = in_stack_ffffffffffffee60;
  name_21._M_len = in_stack_ffffffffffffee58;
  desc_21._M_str._0_4_ = in_stack_ffffffffffffee50;
  desc_21._M_len = (size_t)in_stack_ffffffffffffee48;
  desc_21._M_str._4_4_ = in_stack_ffffffffffffee54.m_bits;
  CommandLine::add(in_stack_ffffffffffffee38,name_21,in_stack_ffffffffffffee30,desc_21,
                   (bitmask<slang::CommandLineFlags>)
                   (underlying_type)((ulong)in_stack_ffffffffffffee40 >> 0x20));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_a84[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_a84);
  name_22._M_str = in_stack_ffffffffffffee60;
  name_22._M_len = in_stack_ffffffffffffee58;
  desc_22._M_str._0_4_ = in_stack_ffffffffffffee50;
  desc_22._M_len = (size_t)in_stack_ffffffffffffee48;
  desc_22._M_str._4_4_ = in_stack_ffffffffffffee54.m_bits;
  CommandLine::add(in_stack_ffffffffffffee38,name_22,in_stack_ffffffffffffee30,desc_22,
                   (bitmask<slang::CommandLineFlags>)
                   (underlying_type)((ulong)in_stack_ffffffffffffee40 >> 0x20));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_aac[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_aac);
  name_23._M_str = in_stack_ffffffffffffee60;
  name_23._M_len = in_stack_ffffffffffffee58;
  desc_23._M_str._0_4_ = in_stack_ffffffffffffee50;
  desc_23._M_len = (size_t)in_stack_ffffffffffffee48;
  desc_23._M_str._4_4_ = in_stack_ffffffffffffee54.m_bits;
  CommandLine::add(in_stack_ffffffffffffee38,name_23,in_stack_ffffffffffffee30,desc_23,
                   (bitmask<slang::CommandLineFlags>)
                   (underlying_type)((ulong)in_stack_ffffffffffffee40 >> 0x20));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  local_ae4[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_ae4);
  name_56._M_str = in_stack_ffffffffffffee70;
  name_56._M_len = in_stack_ffffffffffffee68;
  desc_56._M_str = in_stack_ffffffffffffee60;
  desc_56._M_len = in_stack_ffffffffffffee58;
  valueName_29._M_str = pcVar2;
  valueName_29._M_len = sVar1;
  bVar6.m_bits = local_ae4[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_56,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffee40,desc_56,valueName_29,in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  bitmask<slang::CommandLineFlags>::bitmask(local_b1c,FilePath);
  name_57._M_str = in_stack_ffffffffffffee70;
  name_57._M_len = in_stack_ffffffffffffee68;
  desc_57._M_str = in_stack_ffffffffffffee60;
  desc_57._M_len = in_stack_ffffffffffffee58;
  valueName_30._M_str = pcVar2;
  valueName_30._M_len = sVar1;
  CommandLine::add(in_stack_ffffffffffffee48,name_57,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffee40,desc_57,valueName_30,in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_b1c[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_b1c[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_b1c[0].m_bits));
  local_b54[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_b54);
  name_58._M_str = in_stack_ffffffffffffee70;
  name_58._M_len = in_stack_ffffffffffffee68;
  desc_58._M_str = in_stack_ffffffffffffee60;
  desc_58._M_len = in_stack_ffffffffffffee58;
  valueName_31._M_str = pcVar2;
  valueName_31._M_len = sVar1;
  bVar6.m_bits = local_b54[0].m_bits;
  CommandLine::add(in_stack_ffffffffffffee48,name_58,
                   (optional<unsigned_int> *)in_stack_ffffffffffffee40,desc_58,valueName_31,
                   in_stack_ffffffffffffee54);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>::
  function<slang::driver::Driver::addStandardArgs()::__5,void>
            (in_stack_ffffffffffffedb0,
             (anon_class_8_1_8991fb9c *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,bVar6.m_bits));
  bitmask<slang::CommandLineFlags>::bitmask(local_bb4,CommaList);
  name_59._M_str = in_stack_ffffffffffffee70;
  name_59._M_len = in_stack_ffffffffffffee68;
  desc_59._M_str = in_stack_ffffffffffffee60;
  desc_59._M_len = in_stack_ffffffffffffee58;
  valueName_32._M_str = pcVar2;
  valueName_32._M_len = sVar1;
  CommandLine::add(in_stack_ffffffffffffee48,name_59,in_stack_ffffffffffffee40,desc_59,valueName_32,
                   in_stack_ffffffffffffee54);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x1c5e78);
  pcVar3 = (char *)(in_RDI + 0xc58);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_bb4[0].m_bits));
  std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>::
  function<slang::driver::Driver::addStandardArgs()::__6,void>
            (in_stack_ffffffffffffedb0,
             (anon_class_8_1_8991fb9c *)CONCAT44(in_stack_ffffffffffffedac,local_bb4[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_bb4[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_bb4[0].m_bits));
  bitmask<slang::CommandLineFlags>::bitmask(local_c14,CommaList);
  name_60._M_str = pcVar3;
  name_60._M_len = in_stack_ffffffffffffee68;
  desc_60._M_str = in_stack_ffffffffffffee60;
  desc_60._M_len = in_stack_ffffffffffffee58;
  valueName_33._M_str = pcVar2;
  valueName_33._M_len = sVar1;
  CommandLine::add(in_stack_ffffffffffffee48,name_60,in_stack_ffffffffffffee40,desc_60,valueName_33,
                   in_stack_ffffffffffffee54);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x1c5f67);
  pcVar4 = (char *)(in_RDI + 0xc58);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_c14[0].m_bits));
  sVar5 = in_RDI + 0x1430;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_c14[0].m_bits));
  local_c3c[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_c3c);
  name_24._M_str = pcVar4;
  name_24._M_len = sVar5;
  desc_24._M_str._0_4_ = in_stack_ffffffffffffee50;
  desc_24._M_len = (size_t)in_stack_ffffffffffffee48;
  desc_24._M_str._4_4_ = in_stack_ffffffffffffee54.m_bits;
  CommandLine::add(in_stack_ffffffffffffee38,name_24,in_stack_ffffffffffffee30,desc_24,
                   (bitmask<slang::CommandLineFlags>)
                   (underlying_type)((ulong)in_stack_ffffffffffffee40 >> 0x20));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_c14[0].m_bits));
  puVar8 = local_c70;
  std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>::
  function<slang::driver::Driver::addStandardArgs()::__7,void>
            (in_stack_ffffffffffffedb0,
             (anon_class_8_1_8991fb9c *)CONCAT44(in_stack_ffffffffffffedac,local_c14[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_c14[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_c14[0].m_bits));
  bitmask<slang::CommandLineFlags>::bitmask(local_c9c,CommaList);
  name_61._M_str = pcVar3;
  name_61._M_len = (size_t)puVar8;
  desc_61._M_str = pcVar4;
  desc_61._M_len = sVar5;
  valueName_34._M_str = pcVar2;
  valueName_34._M_len = sVar1;
  CommandLine::add(in_stack_ffffffffffffee48,name_61,in_stack_ffffffffffffee40,desc_61,valueName_34,
                   in_stack_ffffffffffffee54);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x1c60ef);
  this_00 = (CommandLine *)(in_RDI + 0xc58);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_c9c[0].m_bits));
  puVar7 = local_cd0;
  std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>::
  function<slang::driver::Driver::addStandardArgs()::__8,void>
            (in_stack_ffffffffffffedb0,
             (anon_class_8_1_8991fb9c *)CONCAT44(in_stack_ffffffffffffedac,local_c9c[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_c9c[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_c9c[0].m_bits));
  bitmask<slang::CommandLineFlags>::bitmask(local_cfc,CommaList);
  name_62._M_str = pcVar3;
  name_62._M_len = (size_t)puVar8;
  desc_62._M_str = pcVar4;
  desc_62._M_len = sVar5;
  valueName_35._M_str = pcVar2;
  valueName_35._M_len = sVar1;
  CommandLine::add(this_00,name_62,in_stack_ffffffffffffee40,desc_62,valueName_35,
                   (bitmask<slang::CommandLineFlags>)(underlying_type)((ulong)puVar7 >> 0x20));
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x1c61de);
  this_01 = (CommandLine *)(in_RDI + 0xc58);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_cfc[0].m_bits));
  cb = &local_d30;
  std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>::
  function<slang::driver::Driver::addStandardArgs()::__9,void>
            (in_stack_ffffffffffffedb0,
             (anon_class_8_1_8991fb9c *)CONCAT44(in_stack_ffffffffffffedac,local_cfc[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_cfc[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_cfc[0].m_bits));
  bitmask<slang::CommandLineFlags>::bitmask(local_d5c,CommaList);
  name_63._M_str = pcVar3;
  name_63._M_len = (size_t)puVar8;
  desc_63._M_str = pcVar4;
  desc_63._M_len = sVar5;
  valueName_36._M_str = pcVar2;
  valueName_36._M_len = sVar1;
  CommandLine::add(this_00,name_63,cb,desc_63,valueName_36,
                   (bitmask<slang::CommandLineFlags>)(underlying_type)((ulong)puVar7 >> 0x20));
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x1c62cd);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_d5c[0].m_bits));
  value = local_d90;
  std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>::
  function<slang::driver::Driver::addStandardArgs()::__10,void>
            (in_stack_ffffffffffffedb0,
             (anon_class_8_1_8991fb9c *)CONCAT44(in_stack_ffffffffffffedac,local_d5c[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_d5c[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_d5c[0].m_bits));
  bitmask<slang::CommandLineFlags>::bitmask(local_dbc,CommaList);
  name_64._M_str = pcVar3;
  name_64._M_len = (size_t)puVar8;
  desc_64._M_str = pcVar4;
  desc_64._M_len = sVar5;
  valueName_37._M_str = pcVar2;
  valueName_37._M_len = sVar1;
  CommandLine::add(this_00,name_64,cb,desc_64,valueName_37,
                   (bitmask<slang::CommandLineFlags>)(underlying_type)((ulong)puVar7 >> 0x20));
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x1c63bc);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_dbc[0].m_bits));
  std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>::
  function<slang::driver::Driver::addStandardArgs()::__11,void>
            (in_stack_ffffffffffffedb0,
             (anon_class_8_1_8991fb9c *)CONCAT44(in_stack_ffffffffffffedac,local_dbc[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_dbc[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_dbc[0].m_bits));
  bitmask<slang::CommandLineFlags>::bitmask(local_e1c,CommaList);
  name_65._M_str = pcVar3;
  name_65._M_len = (size_t)puVar8;
  desc_65._M_str = pcVar4;
  desc_65._M_len = sVar5;
  valueName_38._M_str = pcVar2;
  valueName_38._M_len = sVar1;
  CommandLine::add(this_00,name_65,cb,desc_65,valueName_38,
                   (bitmask<slang::CommandLineFlags>)(underlying_type)((ulong)puVar7 >> 0x20));
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x1c64ab);
  std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>::
  function<slang::driver::Driver::addStandardArgs()::__12,void>
            (in_stack_ffffffffffffedb0,
             (anon_class_8_1_8991fb9c *)CONCAT44(in_stack_ffffffffffffedac,local_e1c[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_e1c[0].m_bits));
  local_e5c[0].m_bits = 0;
  bitmask<slang::CommandLineFlags>::bitmask(local_e5c);
  valueName._M_str = in_stack_ffffffffffffedf0;
  valueName._M_len = in_stack_ffffffffffffede8;
  CommandLine::setPositional(in_stack_ffffffffffffedd8,in_stack_ffffffffffffedd0,valueName,flags);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x1c6546);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_e1c[0].m_bits));
  std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>::
  function<slang::driver::Driver::addStandardArgs()::__13,void>
            (in_stack_ffffffffffffedb0,
             (anon_class_8_1_8991fb9c *)CONCAT44(in_stack_ffffffffffffedac,local_e1c[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_e1c[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_e1c[0].m_bits));
  bitmask<slang::CommandLineFlags>::bitmask(local_ebc,CommaList);
  name_66._M_str = pcVar3;
  name_66._M_len = (size_t)puVar8;
  desc_66._M_str = pcVar4;
  desc_66._M_len = sVar5;
  valueName_39._M_str = pcVar2;
  valueName_39._M_len = sVar1;
  CommandLine::add(this_00,name_66,cb,desc_66,valueName_39,
                   (bitmask<slang::CommandLineFlags>)(underlying_type)((ulong)puVar7 >> 0x20));
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x1c6629);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_ebc[0].m_bits));
  std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>::
  function<slang::driver::Driver::addStandardArgs()::__14,void>
            (in_stack_ffffffffffffedb0,
             (anon_class_8_1_8991fb9c *)CONCAT44(in_stack_ffffffffffffedac,local_ebc[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_ebc[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_ebc[0].m_bits));
  bitmask<slang::CommandLineFlags>::bitmask(local_f1c,CommaList);
  name_67._M_str = pcVar3;
  name_67._M_len = (size_t)puVar8;
  desc_67._M_str = pcVar4;
  desc_67._M_len = sVar5;
  valueName_40._M_str = pcVar2;
  valueName_40._M_len = sVar1;
  CommandLine::add(this_00,name_67,cb,desc_67,valueName_40,
                   (bitmask<slang::CommandLineFlags>)(underlying_type)((ulong)puVar7 >> 0x20));
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x1c670c);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_f1c[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_f1c[0].m_bits));
  memset(local_f44,0,4);
  bitmask<slang::CommandLineFlags>::bitmask(local_f44);
  name_25._M_str = pcVar4;
  name_25._M_len = sVar5;
  desc_25._M_str._0_4_ = (int)puVar7;
  desc_25._M_len = (size_t)this_00;
  desc_25._M_str._4_4_ = (int)((ulong)puVar7 >> 0x20);
  CommandLine::add(this_01,name_25,value,desc_25,
                   (bitmask<slang::CommandLineFlags>)(underlying_type)((ulong)cb >> 0x20));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_f1c[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_f1c[0].m_bits));
  memset(local_f6c,0,4);
  bitmask<slang::CommandLineFlags>::bitmask(local_f6c);
  name_26._M_str = pcVar4;
  name_26._M_len = sVar5;
  desc_26._M_str._0_4_ = (int)puVar7;
  desc_26._M_len = (size_t)this_00;
  desc_26._M_str._4_4_ = (int)((ulong)puVar7 >> 0x20);
  CommandLine::add(this_01,name_26,value,desc_26,
                   (bitmask<slang::CommandLineFlags>)(underlying_type)((ulong)cb >> 0x20));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_f1c[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_f1c[0].m_bits));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedb0,
             (char *)CONCAT44(in_stack_ffffffffffffedac,local_f1c[0].m_bits));
  memset(local_fa4,0,4);
  bitmask<slang::CommandLineFlags>::bitmask(local_fa4);
  name_68._M_str = pcVar3;
  name_68._M_len = (size_t)puVar8;
  desc_68._M_str = pcVar4;
  desc_68._M_len = sVar5;
  valueName_41._M_str = pcVar2;
  valueName_41._M_len = sVar1;
  CommandLine::add(this_00,name_68,(optional<unsigned_int> *)cb,desc_68,valueName_41,
                   (bitmask<slang::CommandLineFlags>)(underlying_type)((ulong)puVar7 >> 0x20));
  return;
}

Assistant:

void Driver::addStandardArgs() {
    cmdLine.add("--std", options.languageVersion,
                "The version of the SystemVerilog language to use",
                "(1800-2017 | 1800-2023 | latest)");

    // Include paths
    cmdLine.add(
        "-I,--include-directory,+incdir",
        [this](std::string_view value) {
            if (auto ec = sourceManager.addUserDirectories(value)) {
                printWarning(fmt::format("include directory '{}': {}", value, ec.message()));
            }
            return "";
        },
        "Additional include search paths", "<dir-pattern>[,...]", CommandLineFlags::CommaList);

    cmdLine.add(
        "--isystem",
        [this](std::string_view value) {
            if (auto ec = sourceManager.addSystemDirectories(value)) {
                printWarning(fmt::format("system include directory '{}': {}", value, ec.message()));
            }
            return "";
        },
        "Additional system include search paths", "<dir-pattern>[,...]",
        CommandLineFlags::CommaList);

    // Preprocessor
    cmdLine.add("-D,--define-macro,+define", options.defines,
                "Define <macro> to <value> (or 1 if <value> ommitted) in all source files",
                "<macro>=<value>");
    cmdLine.add("-U,--undefine-macro", options.undefines,
                "Undefine macro name at the start of all source files", "<macro>",
                CommandLineFlags::CommaList);
    cmdLine.add("--max-include-depth", options.maxIncludeDepth,
                "Maximum depth of nested include files allowed", "<depth>");
    cmdLine.add("--libraries-inherit-macros", options.librariesInheritMacros,
                "If true, library files will inherit macro definitions from the primary source "
                "files. --single-unit must also be passed when this option is used.");
    cmdLine.add("--enable-legacy-protect", options.enableLegacyProtect,
                "If true, the preprocessor will support legacy protected envelope directives, "
                "for compatibility with old Verilog tools");
    cmdLine.add("--translate-off-format", options.translateOffOptions,
                "Set a format for comment directives that mark a region of disabled "
                "source text. The format is a common keyword, a start word, and an "
                "end word, each separated by commas. For example, "
                "'pragma,translate_off,translate_on'",
                "<common>,<start>,<end>");

    // Legacy vendor commands support
    cmdLine.add(
        "--cmd-ignore", [this](std::string_view value) { return cmdLine.addIgnoreCommand(value); },
        "Define rule to ignore vendor command <vendor_cmd> with its following <N> parameters.\n"
        "A command of the form +xyz will also match any vendor command of the form +xyz+abc,\n"
        "as +abc is the command's argument, and doesn't need to be matched.",
        "<vendor_cmd>,<N>");
    cmdLine.add(
        "--cmd-rename", [this](std::string_view value) { return cmdLine.addRenameCommand(value); },
        "Define rule to rename vendor command <vendor_cmd> into existing <slang_cmd>",
        "<vendor_cmd>,<slang_cmd>");
    cmdLine.add("--ignore-directive", options.ignoreDirectives,
                "Ignore preprocessor directive and all its arguments until EOL", "<directive>",
                CommandLineFlags::CommaList);

    // Parsing
    cmdLine.add("--max-parse-depth", options.maxParseDepth,
                "Maximum depth of nested language constructs allowed", "<depth>");
    cmdLine.add("--max-lexer-errors", options.maxLexerErrors,
                "Maximum number of errors that can occur during lexing before the rest of the file "
                "is skipped",
                "<count>");
    cmdLine.add("-j,--threads", options.numThreads,
                "The number of threads to use to parallelize parsing", "<count>");

    cmdLine.add(
        "-C",
        [this](std::string_view value) {
            processCommandFiles(value, /* makeRelative */ true, /* separateUnit */ true);
            return "";
        },
        "One or more files containing independent compilation unit listings. "
        "The files accept a subset of options that pertain specifically to parsing "
        "that unit and optionally including it in a library.",
        "<file-pattern>[,...]", CommandLineFlags::CommaList);

    // Compilation
    cmdLine.add("--max-hierarchy-depth", options.maxInstanceDepth,
                "Maximum depth of the design hierarchy", "<depth>");
    cmdLine.add("--max-generate-steps", options.maxGenerateSteps,
                "Maximum number of steps that can occur during generate block "
                "evaluation before giving up",
                "<steps>");
    cmdLine.add("--max-constexpr-depth", options.maxConstexprDepth,
                "Maximum depth of a constant evaluation call stack", "<depth>");
    cmdLine.add("--max-constexpr-steps", options.maxConstexprSteps,
                "Maximum number of steps that can occur during constant "
                "evaluation before giving up",
                "<steps>");
    cmdLine.add("--constexpr-backtrace-limit", options.maxConstexprBacktrace,
                "Maximum number of frames to show when printing a constant evaluation "
                "backtrace; the rest will be abbreviated",
                "<limit>");
    cmdLine.add("--max-instance-array", options.maxInstanceArray,
                "Maximum number of instances allowed in a single instance array", "<limit>");
    cmdLine.add("--max-udp-coverage-notes", options.maxUDPCoverageNotes,
                "Maximum number of UDP coverage notes that will be generated for a single "
                "warning about missing edge transitions",
                "<limit>");
    cmdLine.add("--compat", options.compat,
                "Attempt to increase compatibility with the specified tool", "vcs");
    cmdLine.add("-T,--timing", options.minTypMax,
                "Select which value to consider in min:typ:max expressions", "min|typ|max");
    cmdLine.add("--timescale", options.timeScale,
                "Default time scale to use for design elements that don't specify one explicitly",
                "<base>/<precision>");

    auto addCompFlag = [&](CompilationFlags flag, std::string_view name, std::string_view desc) {
        auto [it, inserted] = options.compilationFlags.emplace(flag, std::nullopt);
        SLANG_ASSERT(inserted);
        cmdLine.add(name, it->second, desc);
    };

    addCompFlag(CompilationFlags::AllowUseBeforeDeclare, "--allow-use-before-declare",
                "Don't issue an error for use of names before their declarations");
    addCompFlag(CompilationFlags::IgnoreUnknownModules, "--ignore-unknown-modules",
                "Don't issue an error for instantiations of unknown modules, "
                "interface, and programs");
    addCompFlag(CompilationFlags::RelaxEnumConversions, "--relax-enum-conversions",
                "Allow all integral types to convert implicitly to enum types");
    addCompFlag(CompilationFlags::RelaxStringConversions, "--relax-string-conversions",
                "Allow string types to convert implicitly to integral types");
    addCompFlag(CompilationFlags::AllowHierarchicalConst, "--allow-hierarchical-const",
                "Allow hierarchical references in constant expressions");
    addCompFlag(CompilationFlags::AllowDupInitialDrivers, "--allow-dup-initial-drivers",
                "Allow signals driven in an always_comb or always_ff block to also be driven "
                "by initial blocks");
    addCompFlag(CompilationFlags::AllowTopLevelIfacePorts, "--allow-toplevel-iface-ports",
                "Allow top-level modules to have interface ports");
    addCompFlag(CompilationFlags::AllowRecursiveImplicitCall, "--allow-recursive-implicit-call",
                "Allow implicit call expressions to be recursive function calls");
    addCompFlag(CompilationFlags::AllowBareValParamAssignment, "--allow-bare-value-param-assigment",
                "Allow module parameter assignments to elide the parentheses");
    addCompFlag(CompilationFlags::AllowSelfDeterminedStreamConcat,
                "--allow-self-determined-stream-concat",
                "Allow self-determined streaming concatenation expressions");
    addCompFlag(
        CompilationFlags::AllowMultiDrivenLocals, "--allow-multi-driven-locals",
        "Allow subroutine local variables to be driven from multiple always_comb/_ff blocks");
    addCompFlag(CompilationFlags::AllowMergingAnsiPorts, "--allow-merging-ansi-ports",
                "Allow merging ANSI port declarations with nets and variables declared in the "
                "instance body");
    addCompFlag(CompilationFlags::StrictDriverChecking, "--strict-driver-checking",
                "Perform strict driver checking, which currently means disabling "
                "procedural 'for' loop unrolling");
    addCompFlag(CompilationFlags::LintMode, "--lint-only",
                "Only perform linting of code, don't try to elaborate a full hierarchy");
    addCompFlag(CompilationFlags::DisableInstanceCaching, "--disable-instance-caching",
                "Disable the use of instance caching, which normally allows skipping duplicate "
                "instance bodies to save time when elaborating");

    cmdLine.add("--top", options.topModules,
                "One or more top-level modules to instantiate "
                "(instead of figuring it out automatically)",
                "<name>", CommandLineFlags::CommaList);
    cmdLine.add("-G", options.paramOverrides,
                "One or more parameter overrides to apply when instantiating top-level modules",
                "<name>=<value>");
    cmdLine.add("-L", options.libraryOrder,
                "A list of library names that controls the priority order for module lookup",
                "<library>", CommandLineFlags::CommaList);
    cmdLine.add("--defaultLibName", options.defaultLibName, "Sets the name of the default library",
                "<name>");

    // Diagnostics control
    cmdLine.add("-W", options.warningOptions, "Control the specified warning", "<warning>");
    cmdLine.add("--color-diagnostics", options.colorDiags,
                "Always print diagnostics in color. "
                "If this option is unset, colors will be enabled if a color-capable "
                "terminal is detected.");
    cmdLine.add("--diag-column", options.diagColumn, "Show column numbers in diagnostic output");
    cmdLine.add("--diag-location", options.diagLocation,
                "Show location information in diagnostic output");
    cmdLine.add("--diag-source", options.diagSourceLine,
                "Show source line or caret info in diagnostic output");
    cmdLine.add("--diag-option", options.diagOptionName, "Show option names in diagnostic output");
    cmdLine.add("--diag-include-stack", options.diagIncludeStack,
                "Show include stacks in diagnostic output");
    cmdLine.add("--diag-macro-expansion", options.diagMacroExpansion,
                "Show macro expansion backtraces in diagnostic output");
    cmdLine.add("--diag-abs-paths", options.diagAbsPaths,
                "Display absolute paths to files in diagnostic output");
    cmdLine.add("--diag-hierarchy", options.diagHierarchy,
                "Show hierarchy locations in diagnostic output", "always|never|auto");
    cmdLine.add("--diag-json", options.diagJson,
                "Dump all diagnostics in JSON format to the specified file, or '-' for stdout",
                "<file>", CommandLineFlags::FilePath);
    cmdLine.add("--error-limit", options.errorLimit,
                "Limit on the number of errors that will be printed. Setting this to zero will "
                "disable the limit.",
                "<limit>");

    cmdLine.add(
        "--suppress-warnings",
        [this](std::string_view value) {
            if (auto ec = diagEngine.addIgnorePaths(value))
                printWarning(fmt::format("--suppress-warnings path '{}': {}", value, ec.message()));
            return "";
        },
        "One or more paths in which to suppress warnings", "<file-pattern>[,...]",
        CommandLineFlags::CommaList);

    cmdLine.add(
        "--suppress-macro-warnings",
        [this](std::string_view value) {
            if (auto ec = diagEngine.addIgnoreMacroPaths(value)) {
                printWarning(
                    fmt::format("--suppress-macro-warnings path '{}': {}", value, ec.message()));
            }
            return "";
        },
        "One or more paths in which to suppress warnings that "
        "originate in macro expansions",
        "<file-pattern>[,...]", CommandLineFlags::CommaList);

    // File lists
    cmdLine.add("--single-unit", options.singleUnit,
                "Treat all input files as a single compilation unit");

    cmdLine.add(
        "-v,--libfile",
        [this](std::string_view value) {
            addLibraryFiles(value);
            return "";
        },
        "One or more library files, which are separate compilation units "
        "where modules are not automatically instantiated",
        "<file-pattern>[,...]", CommandLineFlags::CommaList);

    cmdLine.add(
        "--libmap",
        [this](std::string_view value) {
            Bag optionBag;
            addParseOptions(optionBag);
            sourceLoader.addLibraryMaps(value, {}, optionBag);
            return "";
        },
        "One or more library map files to parse "
        "for library name mappings and file lists",
        "<file-pattern>[,...]", CommandLineFlags::CommaList);

    cmdLine.add(
        "-y,--libdir",
        [this](std::string_view value) {
            sourceLoader.addSearchDirectories(value);
            return "";
        },
        "Library search paths, which will be searched for missing modules", "<dir-pattern>[,...]",
        CommandLineFlags::CommaList);

    cmdLine.add(
        "-Y,--libext",
        [this](std::string_view value) {
            sourceLoader.addSearchExtension(value);
            return "";
        },
        "Additional library file extensions to search", "<ext>", CommandLineFlags::CommaList);

    cmdLine.add(
        "--exclude-ext",
        [this](std::string_view value) {
            options.excludeExts.emplace(std::string(value));
            return "";
        },
        "Exclude provided source files with these extensions", "<ext>",
        CommandLineFlags::CommaList);

    cmdLine.setPositional(
        [this](std::string_view value) {
            if (!options.excludeExts.empty()) {
                if (size_t extIndex = value.find_last_of('.'); extIndex != std::string_view::npos) {
                    if (options.excludeExts.count(std::string(value.substr(extIndex + 1))))
                        return "";
                }
            }

            sourceLoader.addFiles(value);
            return "";
        },
        "files");

    cmdLine.add(
        "-f",
        [this](std::string_view value) {
            processCommandFiles(value, /* makeRelative */ false, /* separateUnit */ false);
            return "";
        },
        "One or more command files containing additional program options. "
        "Paths in the file are considered relative to the current directory.",
        "<file-pattern>[,...]", CommandLineFlags::CommaList);

    cmdLine.add(
        "-F",
        [this](std::string_view value) {
            processCommandFiles(value, /* makeRelative */ true, /* separateUnit */ false);
            return "";
        },
        "One or more command files containing additional program options. "
        "Paths in the file are considered relative to the file itself.",
        "<file-pattern>[,...]", CommandLineFlags::CommaList);

    // Analysis modifiers
    cmdLine.add("--dfa-unique-priority", options.dfaUniquePriority,
                "Respect the 'unique' and 'priority' keywords when analyzing data flow "
                "through case statements");

    cmdLine.add("--dfa-four-state", options.dfaFourState,
                "Require that case items cover X and Z bits to assume full coverage "
                "in data flow analysis");

    cmdLine.add("--max-case-analysis-steps", options.maxCaseAnalysisSteps,
                "Maximum number of steps that can occur during case analysis before giving up",
                "<steps>");
}